

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O1

btScalar __thiscall
btCompoundCollisionAlgorithm::calculateTimeOfImpact
          (btCompoundCollisionAlgorithm *this,btCollisionObject *body0,btCollisionObject *body1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  btVector3 *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  btCollisionShape *pbVar11;
  void *pvVar12;
  btCollisionAlgorithm *pbVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  btScalar *pbVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  long lVar30;
  btCollisionObject *pbVar31;
  long lVar32;
  long lVar33;
  float extraout_XMM0_Da;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  
  pbVar31 = body1;
  if (this->m_isSwapped != false) {
    pbVar31 = body0;
    body0 = body1;
  }
  lVar30 = (long)(this->m_childCollisionAlgorithms).m_size;
  if (lVar30 < 1) {
    fVar34 = 1.0;
  }
  else {
    pbVar11 = body0->m_collisionShape;
    fVar34 = 1.0;
    lVar33 = 0x38;
    lVar32 = 0;
    do {
      pvVar12 = pbVar11[1].m_userPointer;
      fVar2 = *(float *)((long)pvVar12 + lVar33 + -0x30);
      fVar3 = *(float *)((long)pvVar12 + lVar33 + -0x20);
      fVar4 = *(float *)((long)pvVar12 + lVar33 + -0x10);
      fVar5 = *(float *)((long)pvVar12 + lVar33 + -8);
      fVar6 = *(float *)((long)pvVar12 + lVar33 + -4);
      fVar7 = *(float *)((long)pvVar12 + lVar33);
      body0->m_updateRevision = body0->m_updateRevision + 1;
      fVar15 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[0];
      fVar16 = (body0->m_worldTransform).m_basis.m_el[0].m_floats[1];
      uVar25 = *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[0].m_floats;
      pbVar24 = (body0->m_worldTransform).m_basis.m_el[0].m_floats + 2;
      fVar17 = *pbVar24;
      uVar26 = *(undefined8 *)pbVar24;
      pbVar1 = (body0->m_worldTransform).m_basis.m_el + 1;
      fVar18 = pbVar1->m_floats[0];
      fVar19 = (body0->m_worldTransform).m_basis.m_el[1].m_floats[1];
      uVar27 = *(undefined8 *)pbVar1->m_floats;
      pbVar24 = (body0->m_worldTransform).m_basis.m_el[1].m_floats + 2;
      fVar20 = *pbVar24;
      uVar28 = *(undefined8 *)pbVar24;
      uVar8 = *(undefined8 *)((long)pvVar12 + lVar33 + -0x38);
      uVar9 = *(undefined8 *)((long)pvVar12 + lVar33 + -0x28);
      uVar10 = *(undefined8 *)((long)pvVar12 + lVar33 + -0x18);
      fVar39 = (float)uVar9;
      fVar40 = (float)((ulong)uVar9 >> 0x20);
      fVar37 = (float)uVar8;
      fVar38 = (float)((ulong)uVar8 >> 0x20);
      fVar35 = (float)uVar10;
      fVar36 = (float)((ulong)uVar10 >> 0x20);
      *(ulong *)(body0->m_worldTransform).m_basis.m_el[0].m_floats =
           CONCAT44(fVar17 * fVar36 + fVar15 * fVar38 + fVar16 * fVar40,
                    fVar17 * fVar35 + fVar15 * fVar37 + fVar16 * fVar39);
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[2] =
           fVar17 * fVar4 + fVar2 * fVar15 + fVar16 * fVar3;
      (body0->m_worldTransform).m_basis.m_el[0].m_floats[3] = 0.0;
      *(ulong *)(body0->m_worldTransform).m_basis.m_el[1].m_floats =
           CONCAT44(fVar20 * fVar36 + fVar18 * fVar38 + fVar19 * fVar40,
                    fVar20 * fVar35 + fVar18 * fVar37 + fVar19 * fVar39);
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[2] =
           fVar20 * fVar4 + fVar2 * fVar18 + fVar19 * fVar3;
      (body0->m_worldTransform).m_basis.m_el[1].m_floats[3] = 0.0;
      pbVar1 = (body0->m_worldTransform).m_basis.m_el + 2;
      fVar21 = pbVar1->m_floats[0];
      fVar22 = (body0->m_worldTransform).m_basis.m_el[2].m_floats[1];
      uVar8 = *(undefined8 *)pbVar1->m_floats;
      pbVar24 = (body0->m_worldTransform).m_basis.m_el[2].m_floats + 2;
      fVar23 = *pbVar24;
      uVar9 = *(undefined8 *)pbVar24;
      *(ulong *)(body0->m_worldTransform).m_basis.m_el[2].m_floats =
           CONCAT44(fVar23 * fVar36 + fVar21 * fVar38 + fVar22 * fVar40,
                    fVar23 * fVar35 + fVar21 * fVar37 + fVar22 * fVar39);
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[2] =
           fVar4 * fVar23 + fVar2 * fVar21 + fVar3 * fVar22;
      (body0->m_worldTransform).m_basis.m_el[2].m_floats[3] = 0.0;
      pbVar1 = &(body0->m_worldTransform).m_origin;
      uVar10 = *(undefined8 *)pbVar1->m_floats;
      pbVar24 = (body0->m_worldTransform).m_origin.m_floats + 2;
      uVar29 = *(undefined8 *)pbVar24;
      auVar14._4_4_ =
           fVar20 * fVar7 + fVar18 * fVar5 + fVar6 * fVar19 +
           (body0->m_worldTransform).m_origin.m_floats[1];
      auVar14._0_4_ = fVar17 * fVar7 + fVar15 * fVar5 + fVar6 * fVar16 + pbVar1->m_floats[0];
      auVar14._8_4_ = *pbVar24 + fVar23 * fVar7 + fVar5 * fVar21 + fVar22 * fVar6;
      auVar14._12_4_ = 0;
      *(undefined1 (*) [16])(body0->m_worldTransform).m_origin.m_floats = auVar14;
      pbVar13 = (this->m_childCollisionAlgorithms).m_data[lVar32];
      (*pbVar13->_vptr_btCollisionAlgorithm[3])(pbVar13,body0,pbVar31,dispatchInfo,resultOut);
      fVar2 = extraout_XMM0_Da;
      if (fVar34 <= extraout_XMM0_Da) {
        fVar2 = fVar34;
      }
      fVar34 = fVar2;
      body0->m_updateRevision = body0->m_updateRevision + 1;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[0].m_floats = uVar25;
      *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[0].m_floats + 2) = uVar26;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[1].m_floats = uVar27;
      *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[1].m_floats + 2) = uVar28;
      *(undefined8 *)(body0->m_worldTransform).m_basis.m_el[2].m_floats = uVar8;
      *(undefined8 *)((body0->m_worldTransform).m_basis.m_el[2].m_floats + 2) = uVar9;
      *(undefined8 *)(body0->m_worldTransform).m_origin.m_floats = uVar10;
      *(undefined8 *)((body0->m_worldTransform).m_origin.m_floats + 2) = uVar29;
      lVar32 = lVar32 + 1;
      lVar33 = lVar33 + 0x58;
    } while (lVar30 != lVar32);
  }
  return fVar34;
}

Assistant:

btScalar	btCompoundCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	btAssert(0);
	//needs to be fixed, using btCollisionObjectWrapper and NOT modifying internal data structures
	btCollisionObject* colObj = m_isSwapped? body1 : body0;
	btCollisionObject* otherObj = m_isSwapped? body0 : body1;

	btAssert (colObj->getCollisionShape()->isCompound());
	
	btCompoundShape* compoundShape = static_cast<btCompoundShape*>(colObj->getCollisionShape());

	//We will use the OptimizedBVH, AABB tree to cull potential child-overlaps
	//If both proxies are Compound, we will deal with that directly, by performing sequential/parallel tree traversals
	//given Proxy0 and Proxy1, if both have a tree, Tree0 and Tree1, this means:
	//determine overlapping nodes of Proxy1 using Proxy0 AABB against Tree1
	//then use each overlapping node AABB against Tree0
	//and vise versa.

	btScalar hitFraction = btScalar(1.);

	int numChildren = m_childCollisionAlgorithms.size();
	int i;
    btTransform	orgTrans;
    btScalar frac;
	for (i=0;i<numChildren;i++)
	{
		//btCollisionShape* childShape = compoundShape->getChildShape(i);

		//backup
        orgTrans = colObj->getWorldTransform();
	
		const btTransform& childTrans = compoundShape->getChildTransform(i);
		//btTransform	newChildWorldTrans = orgTrans*childTrans ;
		colObj->setWorldTransform( orgTrans*childTrans );

		//btCollisionShape* tmpShape = colObj->getCollisionShape();
		//colObj->internalSetTemporaryCollisionShape( childShape );
        frac = m_childCollisionAlgorithms[i]->calculateTimeOfImpact(colObj,otherObj,dispatchInfo,resultOut);
		if (frac<hitFraction)
		{
			hitFraction = frac;
		}
		//revert back
		//colObj->internalSetTemporaryCollisionShape( tmpShape);
		colObj->setWorldTransform( orgTrans);
	}
	return hitFraction;

}